

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

void wr_player(void)

{
  int local_c;
  wchar_t i;
  
  wr_string(player->full_name);
  wr_string(player->died_from);
  wr_string(player->history);
  wr_string(player->race->name);
  wr_string(player->shape->name);
  wr_string(player->class->name);
  wr_byte((player->opts).name_suffix);
  wr_byte(player->hitdie);
  wr_byte(player->expfact);
  wr_s16b(player->age);
  wr_s16b(player->ht);
  wr_s16b(player->wt);
  wr_byte('\x05');
  for (local_c = 0; local_c < 5; local_c = local_c + 1) {
    wr_s16b(player->stat_max[local_c]);
  }
  for (local_c = 0; local_c < 5; local_c = local_c + 1) {
    wr_s16b(player->stat_cur[local_c]);
  }
  for (local_c = 0; local_c < 5; local_c = local_c + 1) {
    wr_s16b(player->stat_map[local_c]);
  }
  for (local_c = 0; local_c < 5; local_c = local_c + 1) {
    wr_s16b(player->stat_birth[local_c]);
  }
  wr_s16b(player->ht_birth);
  wr_s16b(player->wt_birth);
  wr_s16b(0);
  wr_u32b(player->au_birth);
  wr_string((player->body).name);
  wr_u16b((player->body).count);
  for (local_c = 0; local_c < (int)(uint)(player->body).count; local_c = local_c + 1) {
    wr_u16b((player->body).slots[local_c].type);
    wr_string((player->body).slots[local_c].name);
  }
  wr_u32b(0);
  wr_u32b(player->au);
  wr_u32b(player->max_exp);
  wr_u32b(player->exp);
  wr_u16b(player->exp_frac);
  wr_s16b(player->lev);
  wr_s16b(player->mhp);
  wr_s16b(player->chp);
  wr_u16b(player->chp_frac);
  wr_s16b(player->msp);
  wr_s16b(player->csp);
  wr_u16b(player->csp_frac);
  wr_s16b(player->max_lev);
  wr_s16b(player->max_depth);
  wr_s16b(player->recall_depth);
  wr_byte((uint8_t)(player->old_grid).y);
  wr_byte((uint8_t)(player->old_grid).x);
  wr_s16b(0);
  wr_s16b(0);
  wr_byte(player->skip_cmd_coercion);
  wr_byte(player->unignoring);
  wr_s16b(player->deep_descent);
  wr_s16b(player->energy);
  wr_s16b(player->word_recall);
  wr_byte('5');
  for (local_c = 0; local_c < 0x35; local_c = local_c + 1) {
    wr_s16b(player->timed[local_c]);
  }
  wr_u32b(player->total_energy);
  wr_u32b(player->resting_turn);
  for (local_c = 0; local_c < 8; local_c = local_c + 1) {
    wr_u32b(0);
  }
  return;
}

Assistant:

void wr_player(void)
{
	int i;

	wr_string(player->full_name);

	wr_string(player->died_from);

	wr_string(player->history);

	/* Race/Class/Gender/Spells */
	wr_string(player->race->name);
	wr_string(player->shape->name);
	wr_string(player->class->name);
	wr_byte(player->opts.name_suffix);

	wr_byte(player->hitdie);
	wr_byte(player->expfact);

	wr_s16b(player->age);
	wr_s16b(player->ht);
	wr_s16b(player->wt);

	/* Dump the stats (maximum and current and birth and swap-mapping) */
	wr_byte(STAT_MAX);
	for (i = 0; i < STAT_MAX; ++i) wr_s16b(player->stat_max[i]);
	for (i = 0; i < STAT_MAX; ++i) wr_s16b(player->stat_cur[i]);
	for (i = 0; i < STAT_MAX; ++i) wr_s16b(player->stat_map[i]);
	for (i = 0; i < STAT_MAX; ++i) wr_s16b(player->stat_birth[i]);

	wr_s16b(player->ht_birth);
	wr_s16b(player->wt_birth);
	wr_s16b(0);
	wr_u32b(player->au_birth);

	/* Player body */
	wr_string(player->body.name);
	wr_u16b(player->body.count);
	for (i = 0; i < player->body.count; i++) {
		wr_u16b(player->body.slots[i].type);
		wr_string(player->body.slots[i].name);
	}

	/* Padding */
	wr_u32b(0);

	wr_u32b(player->au);


	wr_u32b(player->max_exp);
	wr_u32b(player->exp);
	wr_u16b(player->exp_frac);
	wr_s16b(player->lev);

	wr_s16b(player->mhp);
	wr_s16b(player->chp);
	wr_u16b(player->chp_frac);

	wr_s16b(player->msp);
	wr_s16b(player->csp);
	wr_u16b(player->csp_frac);

	/* Max Player and Dungeon Levels */
	wr_s16b(player->max_lev);
	wr_s16b(player->max_depth);
	wr_s16b(player->recall_depth);

	/* More info */
	wr_byte(player->old_grid.y);
	wr_byte(player->old_grid.x);
	wr_s16b(0);	/* oops */
	wr_s16b(0);	/* oops */
	wr_byte(player->skip_cmd_coercion);
	wr_byte(player->unignoring);
	wr_s16b(player->deep_descent);

	wr_s16b(player->energy);
	wr_s16b(player->word_recall);

	/* Find the number of timed effects */
	wr_byte(TMD_MAX);

	/* Read all the effects, in a loop */
	for (i = 0; i < TMD_MAX; i++)
		wr_s16b(player->timed[i]);

	/* Total energy used so far */
	wr_u32b(player->total_energy);
	/* # of turns spent resting */
	wr_u32b(player->resting_turn);

	/* Future use */
	for (i = 0; i < 8; i++) wr_u32b(0L);
}